

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O1

void __thiscall
indigox::utils::
Graph<indigox::TDVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>::Graph
          (Graph<indigox::TDVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
           *this)

{
  type *ptVar1;
  ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
  *poVar2;
  ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
  *poVar3;
  type *ptVar4;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>
  *poVar5;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>
  *poVar6;
  undefined1 local_19;
  
  (this->graph_).
  super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::TDVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<boost::adjacency_list<boost::setS,boost::listS,boost::undirectedS,indigox::TDVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>,std::allocator<boost::adjacency_list<boost::setS,boost::listS,boost::undirectedS,indigox::TDVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>>>
            (&(this->graph_).
              super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::TDVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             (adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::TDVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>
              **)this,(allocator<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::TDVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>_>
                       *)&local_19);
  ptVar1 = &(this->vert_idxmap_).core.super_type;
  this->next_edge_id_ = 0;
  this->next_vert_id_ = 0;
  *(type **)((long)&(this->vert_idxmap_).super_relation_set.super_set_adaptor<_1e4cf98f_>.
                    super_ordered_associative_container_adaptor<_e8c6ae90_>.super_type.super_type.
                    dwfb + 8) = ptVar1;
  poVar5 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>
            *)operator_new(0x40);
  (this->vert_idxmap_).core.
  super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>_*,_boost::multi_index::multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
  .member = poVar5;
  poVar2 = &(poVar5->
            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
            ).
            super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
  ;
  (poVar5->
  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
  ).
  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
  .
  super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .
  super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .super_type.parentcolor_ = 0;
  (poVar5->
  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
  ).
  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
  .
  super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .
  super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .super_type.left_ =
       &poVar2->
        super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  ;
  (poVar5->
  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
  ).
  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
  .
  super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .
  super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .super_type.right_ =
       &poVar2->
        super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  ;
  (poVar5->
  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>
  ).
  super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .
  super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .super_type.parentcolor_ = 0;
  (poVar5->
  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>
  ).
  super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .
  super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .super_type.left_ =
       &(poVar5->
        super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>
        ).
        super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  ;
  (poVar5->
  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>
  ).
  super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .
  super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .super_type.right_ =
       &(poVar5->
        super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>
        ).
        super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  ;
  (this->vert_idxmap_).core.node_count = 0;
  (this->vert_idxmap_).left.super_map_adaptor<_1e6ad140_>.
  super_ordered_associative_container_adaptor<_140da2db_>.super_type.super_type.dwfb.data =
       (ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>,_void_*,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<void_*>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
        *)ptVar1;
  (this->vert_idxmap_).right.super_map_adaptor<_64c1845f_>.
  super_ordered_associative_container_adaptor<_f87bdd2f_>.super_type.super_type.dwfb.data = ptVar1;
  ptVar4 = &(this->edge_idxmap_).core.super_type;
  *(type **)((long)&(this->edge_idxmap_).super_relation_set.super_set_adaptor<_c9ff9997_>.
                    super_ordered_associative_container_adaptor<_7d573cef_>.super_type.super_type.
                    dwfb + 8) = ptVar4;
  poVar6 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>
            *)operator_new(0x50);
  (this->edge_idxmap_).core.
  super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>_*,_boost::multi_index::multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
  .member = poVar6;
  poVar3 = &(poVar6->
            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
            ).
            super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
  ;
  (poVar6->
  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
  ).
  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
  .
  super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .
  super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .super_type.parentcolor_ = 0;
  (poVar6->
  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
  ).
  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
  .
  super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .
  super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .super_type.left_ =
       &poVar3->
        super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  ;
  (poVar6->
  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
  ).
  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
  .
  super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .
  super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .super_type.right_ =
       &poVar3->
        super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  ;
  (poVar6->
  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>
  ).
  super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .
  super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .super_type.parentcolor_ = 0;
  (poVar6->
  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>
  ).
  super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .
  super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .super_type.left_ =
       &(poVar6->
        super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>
        ).
        super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  ;
  (poVar6->
  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>
  ).
  super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .
  super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .super_type.right_ =
       &(poVar6->
        super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>
        ).
        super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  ;
  (this->edge_idxmap_).core.node_count = 0;
  (this->edge_idxmap_).left.super_map_adaptor<_e5f1b85b_>.
  super_ordered_associative_container_adaptor<_bdb84721_>.super_type.super_type.dwfb.data =
       (ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
        *)ptVar4;
  (this->edge_idxmap_).right.super_map_adaptor<_67f28d46_>.
  super_ordered_associative_container_adaptor<_e0d73600_>.super_type.super_type.dwfb.data = ptVar4;
  return;
}

Assistant:

Graph() : graph_(std::make_shared<T>())
      {}